

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O1

void __thiscall
sptk::GaussianMixtureModeling::GaussianMixtureModeling
          (GaussianMixtureModeling *this,int num_order,int num_mixture,int num_iteration,
          double convergence_threshold,CovarianceType covariance_type,
          vector<int,_std::allocator<int>_> *block_size,double weight_floor,double variance_floor,
          InitializationType initialization_type,int log_interval,double smoothing_parameter,
          vector<double,_std::allocator<double>_> *ubm_weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *ubm_mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
          *ubm_covariance_matrices)

{
  SymmetricMatrix *this_00;
  uint uVar1;
  int *piVar2;
  pointer piVar3;
  double *pdVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  double *pdVar10;
  int *piVar11;
  pointer pdVar12;
  vector<int,_std::allocator<int>_> *this_01;
  int column;
  ulong uVar13;
  int col;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  vector<int,_std::allocator<int>_> *__range2;
  ulong uVar17;
  double dVar18;
  vector<int,_std::allocator<int>_> offset;
  Row local_a0;
  vector<double,_std::allocator<double>_> *local_88;
  double local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  double local_68;
  vector<int,_std::allocator<int>_> local_60;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  this->_vptr_GaussianMixtureModeling = (_func_int **)&PTR__GaussianMixtureModeling_0011ab80;
  this->num_order_ = num_order;
  this->num_mixture_ = num_mixture;
  this->num_iteration_ = num_iteration;
  this->convergence_threshold_ = convergence_threshold;
  this->covariance_type_ = covariance_type;
  this_01 = &this->block_size_;
  local_74 = num_mixture;
  local_68 = smoothing_parameter;
  std::vector<int,_std::allocator<int>_>::vector(this_01,block_size);
  this->weight_floor_ = weight_floor;
  this->variance_floor_ = variance_floor;
  this->initialization_type_ = initialization_type;
  this->log_interval_ = log_interval;
  this->smoothing_parameter_ = local_68;
  std::vector<double,_std::allocator<double>_>::vector(&this->ubm_weights_,ubm_weights);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->ubm_mean_vectors_,ubm_mean_vectors);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            (&this->ubm_covariance_matrices_,ubm_covariance_matrices);
  if (this->covariance_type_ == kDiagonal) {
    bVar5 = (long)(this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start == 4;
  }
  else {
    bVar5 = false;
  }
  this->is_diagonal_ = bVar5;
  this->is_valid_ = true;
  this_00 = &this->mask_;
  SymmetricMatrix::SymmetricMatrix(this_00,0);
  (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((-1 < this->num_order_) && (0 < this->num_mixture_)) {
    local_88 = &this->xi_;
    if (this->initialization_type_ == kKMeans) {
      bVar5 = IsPowerOfTwo(this->num_mixture_);
      if (!bVar5 || this->num_iteration_ < 1) goto LAB_001079da;
    }
    else if (this->num_iteration_ < 1) goto LAB_001079da;
    if (((((0.0 < this->convergence_threshold_ || this->convergence_threshold_ == 0.0) &&
          (0.0 <= this->weight_floor_)) && (this->weight_floor_ <= 1.0 / (double)this->num_mixture_)
         ) && ((0 < log_interval && (0.0 < this->variance_floor_ || this->variance_floor_ == 0.0))))
       && ((0.0 <= this->smoothing_parameter_ && (this->smoothing_parameter_ <= 1.0)))) {
      piVar9 = (block_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (block_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar5 = piVar9 == piVar2;
      if (bVar5) {
        iVar6 = 0;
      }
      else {
        iVar6 = 0;
        do {
          if (*piVar9 < 1) {
            this->is_valid_ = false;
            break;
          }
          iVar6 = iVar6 + *piVar9;
          piVar9 = piVar9 + 1;
          bVar5 = piVar9 == piVar2;
        } while (!bVar5);
      }
      if (!bVar5) {
        return;
      }
      iVar16 = this->num_order_ + 1;
      if (iVar6 == iVar16) {
        uVar8 = (long)(this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_60,(long)(uVar8 * 0x40000000 + 0x100000000) >> 0x20,
                   (allocator_type *)&local_a0);
        piVar9 = (this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (this->block_size_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar9 != piVar2) {
          iVar6 = *piVar9;
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1] = iVar6;
          piVar9 = piVar9 + 1;
          if (piVar9 != piVar2) {
            piVar11 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 2;
            do {
              iVar6 = iVar6 + *piVar9;
              *piVar11 = iVar6;
              piVar9 = piVar9 + 1;
              piVar11 = piVar11 + 1;
            } while (piVar9 != piVar2);
          }
        }
        local_78 = iVar16;
        SymmetricMatrix::Resize(this_00,iVar16);
        SymmetricMatrix::Fill(this_00,1.0);
        uVar7 = (uint)(uVar8 >> 2);
        if (0 < (int)uVar7) {
          uVar8 = (ulong)(uVar7 & 0x7fffffff);
          uVar15 = 0;
          do {
            local_48 = (ulong)(uint)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar15];
            uVar7 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar15];
            local_40 = (ulong)uVar7;
            local_70 = uVar7 + local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar15];
            uVar14 = 0;
            do {
              if (0 < (int)local_40) {
                uVar7 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14];
                local_80 = (double)(ulong)uVar7;
                uVar1 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar14];
                local_38 = (ulong)uVar1;
                local_6c = -uVar7;
                uVar17 = local_48 & 0xffffffff;
                do {
                  uVar13 = (ulong)local_80 & 0xffffffff;
                  iVar16 = (int)uVar17;
                  iVar6 = local_6c;
                  if (0 < (int)local_38) {
                    do {
                      column = (int)uVar13;
                      if (this->covariance_type_ == kFull) {
                        if (uVar15 != uVar14) {
                          local_a0._vptr_Row = (_func_int **)&PTR__Row_0011ab50;
                          local_a0.matrix_ = this_00;
                          local_a0.row_ = iVar16;
                          pdVar10 = SymmetricMatrix::Row::operator[](&local_a0,column);
                          goto LAB_00107c7b;
                        }
                      }
                      else if (this->covariance_type_ == kDiagonal) {
                        piVar3 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start;
                        if (piVar3[uVar15] == piVar3[uVar14]) {
                          if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar14 + 1] + iVar6 ==
                              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar15 + 1] - iVar16)
                          goto LAB_00107c82;
                          local_a0._vptr_Row = (_func_int **)&PTR__Row_0011ab50;
                          local_a0.matrix_ = this_00;
                          local_a0.row_ = iVar16;
                          pdVar10 = SymmetricMatrix::Row::operator[](&local_a0,column);
                        }
                        else {
                          local_a0._vptr_Row = (_func_int **)&PTR__Row_0011ab50;
                          local_a0.matrix_ = this_00;
                          local_a0.row_ = iVar16;
                          pdVar10 = SymmetricMatrix::Row::operator[](&local_a0,column);
                        }
LAB_00107c7b:
                        *pdVar10 = 0.0;
                      }
LAB_00107c82:
                      uVar13 = (ulong)(column + 1U);
                      iVar6 = iVar6 + -1;
                    } while ((int)(column + 1U) < (int)(uVar1 + uVar7));
                  }
                  uVar17 = (ulong)(iVar16 + 1U);
                } while ((int)(iVar16 + 1U) < local_70);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar8);
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar8);
        }
        if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        dVar18 = this->smoothing_parameter_;
        if (((this->initialization_type_ != kUbm) && (dVar18 <= 0.0)) ||
           (local_80 = dVar18,
           bVar5 = anon_unknown.dwarf_1dba7::CheckGmm
                             (local_74,local_78,ubm_weights,ubm_mean_vectors,ubm_covariance_matrices
                             ), dVar18 = local_80, bVar5)) {
          if (dVar18 <= 0.0) {
            return;
          }
          std::vector<double,_std::allocator<double>_>::resize(local_88,(long)this->num_mixture_);
          pdVar10 = (ubm_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar4 = (ubm_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pdVar10 == pdVar4) {
            return;
          }
          pdVar12 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            *pdVar12 = *pdVar10 * local_68;
            pdVar10 = pdVar10 + 1;
            pdVar12 = pdVar12 + 1;
          } while (pdVar10 != pdVar4);
          return;
        }
      }
    }
  }
LAB_001079da:
  this->is_valid_ = false;
  return;
}

Assistant:

GaussianMixtureModeling::GaussianMixtureModeling(
    int num_order, int num_mixture, int num_iteration,
    double convergence_threshold, CovarianceType covariance_type,
    std::vector<int> block_size, double weight_floor, double variance_floor,
    InitializationType initialization_type, int log_interval,
    double smoothing_parameter, const std::vector<double>& ubm_weights,
    const std::vector<std::vector<double> >& ubm_mean_vectors,
    const std::vector<SymmetricMatrix>& ubm_covariance_matrices)
    : num_order_(num_order),
      num_mixture_(num_mixture),
      num_iteration_(num_iteration),
      convergence_threshold_(convergence_threshold),
      covariance_type_(covariance_type),
      block_size_(block_size),
      weight_floor_(weight_floor),
      variance_floor_(variance_floor),
      initialization_type_(initialization_type),
      log_interval_(log_interval),
      smoothing_parameter_(smoothing_parameter),
      ubm_weights_(ubm_weights),
      ubm_mean_vectors_(ubm_mean_vectors),
      ubm_covariance_matrices_(ubm_covariance_matrices),
      is_diagonal_(kDiagonal == covariance_type_ && 1 == block_size_.size()),
      is_valid_(true) {
  if (num_order_ < 0 || num_mixture_ <= 0 ||
      (kKMeans == initialization_type_ && !sptk::IsPowerOfTwo(num_mixture_)) ||
      num_iteration_ <= 0 || convergence_threshold_ < 0.0 ||
      weight_floor_ < 0.0 || 1.0 / num_mixture_ < weight_floor_ ||
      variance_floor_ < 0.0 || log_interval <= 0 ||
      smoothing_parameter_ < 0.0 || 1.0 < smoothing_parameter_) {
    is_valid_ = false;
    return;
  }

  const int length(num_order_ + 1);

  // Check block size.
  {
    int sum(0);
    for (int b : block_size) {
      if (b <= 0) {
        is_valid_ = false;
        return;
      }
      sum += b;
    }
    if (sum != length) {
      is_valid_ = false;
      return;
    }
  }

  // Create mask of covariance.
  {
    const int num_block(static_cast<int>(block_size_.size()));
    std::vector<int> offset(num_block + 1);
    std::partial_sum(block_size_.begin(), block_size_.end(),
                     offset.begin() + 1);

    mask_.Resize(length);
    mask_.Fill(1.0);
    for (int row(0); row < num_block; ++row) {
      const int begin_l(offset[row]);
      const int end_l(offset[row] + block_size_[row]);
      for (int col(0); col < num_block; ++col) {
        const int begin_m(offset[col]);
        const int end_m(offset[col] + block_size_[col]);
        for (int l(begin_l); l < end_l; ++l) {
          for (int m(begin_m); m < end_m; ++m) {
            if (kDiagonal == covariance_type_) {
              if (block_size_[row] != block_size_[col]) {
                mask_[l][m] = 0.0;
              } else if (offset[row + 1] - l != offset[col + 1] - m) {
                mask_[l][m] = 0.0;
              }
            } else if (kFull == covariance_type_) {
              if (row != col) {
                mask_[l][m] = 0.0;
              }
            }
          }
        }
      }
    }
  }

  // Check the sanity of universal background model.
  if (kUbm == initialization_type_ || 0.0 < smoothing_parameter_) {
    if (!CheckGmm(num_mixture, length, ubm_weights, ubm_mean_vectors,
                  ubm_covariance_matrices)) {
      is_valid_ = false;
      return;
    }
  }

  if (0.0 < smoothing_parameter_) {
    xi_.resize(num_mixture_);
    std::transform(
        ubm_weights.begin(), ubm_weights.end(), xi_.begin(),
        [smoothing_parameter](double w) { return smoothing_parameter * w; });
  }
}